

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

bool __thiscall Lexer::Error(Lexer *this,string *message,string *err)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  pointer pcVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char buf [1024];
  undefined1 *local_460;
  undefined8 local_458;
  undefined1 local_450;
  undefined7 uStack_44f;
  ulong local_440;
  char local_438 [1032];
  
  pcVar7 = (this->input_).str_;
  pcVar2 = this->last_token_;
  uVar8 = 1;
  pcVar9 = pcVar7;
  if (pcVar7 < pcVar2) {
    do {
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
      if (cVar1 == '\n') {
        pcVar9 = pcVar7;
      }
      uVar8 = uVar8 + (cVar1 == '\n');
    } while (pcVar7 != pcVar2);
  }
  local_440 = 0;
  if (pcVar2 != (char *)0x0) {
    local_440 = (ulong)(uint)((int)pcVar2 - (int)pcVar9);
  }
  sVar3 = (this->filename_).len_;
  local_460 = &local_450;
  if (sVar3 == 0) {
    local_458 = 0;
    local_450 = 0;
  }
  else {
    pcVar7 = (this->filename_).str_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,pcVar7,pcVar7 + sVar3);
  }
  snprintf(local_438,0x400,"%s:%d: ",local_460,(ulong)uVar8);
  if (local_460 != &local_450) {
    operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
  }
  pcVar7 = (char *)err->_M_string_length;
  strlen(local_438);
  std::__cxx11::string::_M_replace((ulong)err,0,pcVar7,(ulong)local_438);
  pcVar4 = (message->_M_dataplus)._M_p;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,pcVar4,pcVar4 + message->_M_string_length);
  std::__cxx11::string::append((char *)&local_460);
  std::__cxx11::string::_M_append((char *)err,(ulong)local_460);
  uVar5 = local_440;
  if (local_460 != &local_450) {
    operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
  }
  if ((int)uVar5 - 1U < 0x47) {
    uVar6 = 0;
    bVar10 = false;
    do {
      if ((pcVar9[uVar6] == '\0') || (pcVar9[uVar6] == '\n')) goto LAB_001258ce;
      bVar10 = 0x46 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x48);
    uVar6 = 0x48;
LAB_001258ce:
    local_460 = &local_450;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_460,pcVar9,pcVar9 + (uVar6 & 0xffffffff));
    std::__cxx11::string::_M_append((char *)err,(ulong)local_460);
    if (local_460 != &local_450) {
      operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
    }
    if (bVar10) {
      std::__cxx11::string::append((char *)err);
    }
    std::__cxx11::string::append((char *)err);
    local_460 = &local_450;
    std::__cxx11::string::_M_construct((ulong)&local_460,(char)uVar5);
    std::__cxx11::string::_M_append((char *)err,(ulong)local_460);
    if (local_460 != &local_450) {
      operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
    }
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool Lexer::Error(const string& message, string* err) {
  // Compute line/column.
  int line = 1;
  const char* line_start = input_.str_;
  for (const char* p = input_.str_; p < last_token_; ++p) {
    if (*p == '\n') {
      ++line;
      line_start = p + 1;
    }
  }
  int col = last_token_ ? (int)(last_token_ - line_start) : 0;

  char buf[1024];
  snprintf(buf, sizeof(buf), "%s:%d: ", filename_.AsString().c_str(), line);
  *err = buf;
  *err += message + "\n";

  // Add some context to the message.
  const int kTruncateColumn = 72;
  if (col > 0 && col < kTruncateColumn) {
    int len;
    bool truncated = true;
    for (len = 0; len < kTruncateColumn; ++len) {
      if (line_start[len] == 0 || line_start[len] == '\n') {
        truncated = false;
        break;
      }
    }
    *err += string(line_start, len);
    if (truncated)
      *err += "...";
    *err += "\n";
    *err += string(col, ' ');
    *err += "^ near here";
  }

  return false;
}